

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,ShapeSampleContext *ctx,
          Point2f u)

{
  Float FVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Transform *pTVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ulong uVar17;
  undefined1 auVar18 [16];
  anon_struct_8_0_00000001_for___align aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  int iVar24;
  undefined1 auVar27 [16];
  float fVar23;
  float fVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [64];
  float fVar34;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar48 [64];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar74;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  Point3f PVar78;
  optional<pbrt::ShapeSample> ss;
  float local_11c;
  undefined1 local_118 [8];
  float fStack_110;
  float fStack_10c;
  undefined1 local_e8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_b8;
  bool local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 auVar31 [64];
  undefined1 auVar33 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 auVar49 [56];
  
  local_e8._8_8_ = in_XMM0_Qb;
  local_e8._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  pTVar7 = this->renderFromObject;
  auVar29 = ZEXT816(0) << 0x40;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[0][1] * 0.0)),auVar29,
                            ZEXT416((uint)(pTVar7->m).m[0][0]));
  auVar26 = vfmadd231ss_fma(auVar26,auVar29,ZEXT416((uint)(pTVar7->m).m[0][2]));
  fVar67 = auVar26._0_4_ + (pTVar7->m).m[0][3];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[1][1] * 0.0)),auVar29,
                            ZEXT416((uint)(pTVar7->m).m[1][0]));
  auVar26 = vfmadd231ss_fma(auVar26,auVar29,ZEXT416((uint)(pTVar7->m).m[1][2]));
  fVar35 = auVar26._0_4_ + (pTVar7->m).m[1][3];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[2][1] * 0.0)),auVar29,
                            ZEXT416((uint)(pTVar7->m).m[2][0]));
  auVar26 = vfmadd231ss_fma(auVar26,auVar29,ZEXT416((uint)(pTVar7->m).m[2][2]));
  fVar23 = auVar26._0_4_ + (pTVar7->m).m[2][3];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((pTVar7->m).m[3][1] * 0.0)),auVar29,
                            ZEXT416((uint)(pTVar7->m).m[3][0]));
  auVar26 = vfmadd231ss_fma(auVar26,auVar29,ZEXT416((uint)(pTVar7->m).m[3][2]));
  fVar66 = auVar26._0_4_ + (pTVar7->m).m[3][3];
  bVar8 = fVar66 == 1.0;
  fVar65 = fVar67 / fVar66;
  fVar75 = fVar35 / fVar66;
  auVar31._16_48_ = in_ZmmResult._16_48_;
  auVar31._0_16_ = ZEXT416((uint)fVar65);
  auVar30._4_60_ = auVar31._4_60_;
  auVar30._0_4_ = (uint)bVar8 * (int)fVar67 + (uint)!bVar8 * (int)fVar65;
  auVar33._16_48_ = auVar31._16_48_;
  auVar33._0_16_ = ZEXT416((uint)fVar75);
  auVar32._4_60_ = auVar33._4_60_;
  auVar32._0_4_ = (uint)bVar8 * (int)fVar35 + (uint)!bVar8 * (int)fVar75;
  auVar29 = vinsertps_avx(auVar30._0_16_,auVar32._0_16_,0x10);
  fVar23 = (float)((uint)bVar8 * (int)fVar23 + (uint)!bVar8 * (int)(fVar23 / fVar66));
  auVar26._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar26._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar26._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar26._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar26 = vinsertps_avx(auVar26,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar28._0_4_ = (float)uVar2 + auVar26._0_4_;
  auVar28._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar26._4_4_;
  auVar28._8_4_ = auVar26._8_4_ + 0.0;
  auVar28._12_4_ = auVar26._12_4_ + 0.0;
  auVar27._8_4_ = 0xbf000000;
  auVar27._0_8_ = 0xbf000000bf000000;
  auVar27._12_4_ = 0xbf000000;
  auVar26 = vmulps_avx512vl(auVar28,auVar27);
  fVar66 = auVar29._0_4_;
  auVar36._0_4_ = fVar66 + auVar26._0_4_;
  fVar65 = auVar29._4_4_;
  auVar36._4_4_ = fVar65 + auVar26._4_4_;
  fVar75 = auVar29._8_4_;
  auVar36._8_4_ = fVar75 + auVar26._8_4_;
  fVar74 = auVar29._12_4_;
  auVar36._12_4_ = fVar74 + auVar26._12_4_;
  auVar49 = ZEXT856(auVar36._8_8_);
  local_b8._8_4_ =
       fVar23 + ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low + (ctx->pi).super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  uVar2 = vmovlps_avx(auVar36);
  local_b8._0_4_ = (undefined4)uVar2;
  local_b8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  PVar78 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_b8.__align);
  auVar44._0_8_ = PVar78.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar44._8_56_ = auVar49;
  fVar35 = PVar78.super_Tuple3<pbrt::Point3,_float>.z - fVar23;
  auVar26 = vsubps_avx(auVar44._0_16_,auVar29);
  auVar37._0_4_ = auVar26._0_4_ * auVar26._0_4_;
  auVar37._4_4_ = auVar26._4_4_ * auVar26._4_4_;
  auVar37._8_4_ = auVar26._8_4_ * auVar26._8_4_;
  auVar37._12_4_ = auVar26._12_4_ * auVar26._12_4_;
  auVar26 = vhaddps_avx(auVar37,auVar37);
  fVar67 = this->radius;
  if (fVar67 * fVar67 < fVar35 * fVar35 + auVar26._0_4_) {
    auVar3._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar3._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar3._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar3._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar26 = vinsertps_avx(auVar3,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    auVar38._0_4_ = (float)uVar2 + auVar26._0_4_;
    auVar38._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar26._4_4_;
    auVar38._8_4_ = auVar26._8_4_ + 0.0;
    auVar38._12_4_ = auVar26._12_4_ + 0.0;
    auVar12._8_4_ = 0x3f000000;
    auVar12._0_8_ = 0x3f0000003f000000;
    auVar12._12_4_ = 0x3f000000;
    auVar26 = vmulps_avx512vl(auVar38,auVar12);
    auVar26 = vsubps_avx(auVar26,auVar29);
    auVar29._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar29._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar29._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar29._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar26 = vhaddps_avx(auVar29,auVar29);
    fVar35 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5 - fVar23;
    fVar35 = auVar26._0_4_ + fVar35 * fVar35;
    if (fVar35 < 0.0) {
      fVar35 = sqrtf(fVar35);
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar35 = auVar26._0_4_;
    }
    fVar67 = fVar67 / fVar35;
    fVar35 = fVar67 * fVar67;
    auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar35)),ZEXT816(0) << 0x40);
    if (auVar26._0_4_ < 0.0) {
      fVar25 = sqrtf(auVar26._0_4_);
    }
    else {
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      fVar25 = auVar26._0_4_;
    }
    if (0.00068523 <= fVar35) {
      local_11c = 1.0 - fVar25;
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)(fVar25 + -1.0)),local_e8,
                                SUB6416(ZEXT464(0x3f800000),0));
      fVar25 = 1.0 - auVar26._0_4_ * auVar26._0_4_;
    }
    else {
      fVar25 = u.super_Tuple2<pbrt::Point2,_float>.x * fVar35;
      fVar34 = 1.0 - fVar25;
      if (fVar34 < 0.0) {
        auVar45._0_4_ = sqrtf(fVar34);
        auVar45._4_60_ = extraout_var;
        auVar26 = auVar45._0_16_;
      }
      else {
        auVar26 = vsqrtss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34));
      }
      local_11c = fVar35 * 0.5;
    }
    auVar27 = ZEXT816(0);
    auVar29 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar25 / fVar35)),auVar27);
    if (auVar29._0_4_ < 0.0) {
      auVar46._0_4_ = sqrtf(auVar29._0_4_);
      auVar46._4_60_ = extraout_var_00;
      auVar29 = auVar46._0_16_;
      auVar27 = ZEXT816(0) << 0x40;
      auVar26 = ZEXT416(auVar26._0_4_);
    }
    else {
      auVar29 = vsqrtss_avx(auVar29,auVar29);
    }
    auVar29 = vfmadd213ss_fma(auVar29,auVar26,ZEXT416((uint)(fVar25 / fVar67)));
    auVar26 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar29._0_4_ * auVar29._0_4_)),auVar27);
    if (auVar26._0_4_ < 0.0) {
      auVar47._0_4_ = sqrtf(auVar26._0_4_);
      auVar47._4_60_ = extraout_var_01;
      auVar26 = auVar47._0_16_;
    }
    else {
      auVar26 = vsqrtss_avx(auVar26,auVar26);
    }
    auVar27 = vmovshdup_avx(local_e8);
    local_58._0_4_ = (auVar27._0_4_ + auVar27._0_4_) * 3.1415927;
    auVar27 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
    uVar2 = vcmpss_avx512f(auVar26,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar8 = (bool)((byte)uVar2 & 1);
    iVar24 = (uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar27._0_4_;
    fVar34 = cosf((float)local_58._0_4_);
    auVar48._0_4_ = sinf((float)local_58._0_4_);
    auVar48._4_60_ = extraout_var_02;
    auVar5._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar5._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar5._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar5._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    fVar67 = fVar23 + ((ctx->pi).super_Point3<pbrt::Interval>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                      (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
    auVar13._8_4_ = 0x80000000;
    auVar13._0_8_ = 0x8000000080000000;
    auVar13._12_4_ = 0x80000000;
    auVar27 = vxorps_avx512vl(auVar29,auVar13);
    uVar2 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar29,1);
    bVar8 = (bool)((byte)uVar2 & 1);
    uVar2 = vcmpss_avx512f(auVar29,SUB6416(ZEXT464(0xbf800000),0),1);
    bVar11 = (bool)((byte)uVar2 & 1);
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              high;
    auVar26 = vinsertps_avx(auVar5,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                            0x10);
    auVar40._0_4_ = (float)uVar2 + auVar26._0_4_;
    auVar40._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar26._4_4_;
    auVar40._8_4_ = auVar26._8_4_ + 0.0;
    auVar40._12_4_ = auVar26._12_4_ + 0.0;
    auVar14._8_4_ = 0xbf000000;
    auVar14._0_8_ = 0xbf000000bf000000;
    auVar14._12_4_ = 0xbf000000;
    auVar26 = vmulps_avx512vl(auVar40,auVar14);
    auVar68._0_4_ = fVar66 + auVar26._0_4_;
    auVar68._4_4_ = fVar65 + auVar26._4_4_;
    auVar68._8_4_ = fVar75 + auVar26._8_4_;
    auVar68._12_4_ = fVar74 + auVar26._12_4_;
    auVar41._0_4_ = auVar68._0_4_ * auVar68._0_4_;
    auVar41._4_4_ = auVar68._4_4_ * auVar68._4_4_;
    auVar41._8_4_ = auVar68._8_4_ * auVar68._8_4_;
    auVar41._12_4_ = auVar68._12_4_ * auVar68._12_4_;
    auVar26 = vhaddps_avx(auVar41,auVar41);
    fVar25 = (float)((uint)bVar11 * 0x3f800000 +
                    (uint)!bVar11 * ((uint)bVar8 * -0x40800000 + (uint)!bVar8 * auVar27._0_4_));
    fVar35 = auVar26._0_4_ + fVar67 * fVar67;
    if (fVar35 < 0.0) {
      local_58 = auVar48._0_16_;
      local_48 = auVar68;
      fVar35 = sqrtf(fVar35);
      auVar68 = local_48;
      auVar26 = local_58;
    }
    else {
      auVar26 = vsqrtss_avx(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar35 = auVar26._0_4_;
      auVar26 = auVar48._0_16_;
    }
    auVar53._4_4_ = fVar35;
    auVar53._0_4_ = fVar35;
    auVar53._8_4_ = fVar35;
    auVar53._12_4_ = fVar35;
    auVar29 = vdivps_avx(auVar68,auVar53);
    auVar58._0_4_ = fVar67 / fVar35;
    auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar62._8_4_ = 0x3f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    auVar62._12_4_ = 0x3f800000;
    auVar42._8_4_ = 0x80000000;
    auVar42._0_8_ = 0x8000000080000000;
    auVar42._12_4_ = 0x80000000;
    auVar28 = vpternlogd_avx512vl(auVar62,auVar58,auVar42,0xf8);
    fVar61 = auVar28._0_4_;
    auVar69._0_4_ = -1.0 / (auVar58._0_4_ + fVar61);
    auVar27 = vmovshdup_avx(auVar29);
    fVar50 = auVar29._0_4_;
    fVar10 = fVar50 * auVar27._0_4_ * auVar69._0_4_;
    auVar76._0_4_ = fVar50 * fVar61 * fVar50;
    fVar67 = auVar29._4_4_;
    auVar76._4_4_ = fVar67 * 0.0;
    fVar35 = auVar29._8_4_;
    auVar76._8_4_ = fVar35 * 0.0;
    fVar9 = auVar29._12_4_;
    auVar76._12_4_ = fVar9 * 0.0;
    auVar69._4_4_ = auVar69._0_4_;
    auVar69._8_4_ = auVar69._0_4_;
    auVar69._12_4_ = auVar69._0_4_;
    auVar77._8_4_ = 0x3f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._12_4_ = 0x3f800000;
    auVar29 = vunpcklps_avx(auVar77,auVar28);
    auVar27 = vfmadd231ps_fma(auVar29,auVar76,auVar69);
    auVar70._4_4_ = iVar24;
    auVar70._0_4_ = iVar24;
    auVar70._8_4_ = iVar24;
    auVar70._12_4_ = iVar24;
    auVar70 = auVar70 ^ auVar42;
    auVar18._4_4_ = extraout_XMM0_Db;
    auVar18._0_4_ = fVar34;
    auVar18._8_4_ = extraout_XMM0_Dc;
    auVar18._12_4_ = extraout_XMM0_Dd;
    auVar26 = vinsertps_avx(auVar18,auVar26,0x10);
    auVar71._0_4_ = auVar26._0_4_ * auVar70._0_4_;
    auVar71._4_4_ = auVar26._4_4_ * auVar70._4_4_;
    auVar71._8_4_ = auVar26._8_4_ * auVar70._8_4_;
    auVar71._12_4_ = auVar26._12_4_ * auVar70._12_4_;
    auVar28 = vpermi2ps_avx512vl(_DAT_02875000,ZEXT416((uint)(fVar61 * fVar10)),
                                 ZEXT416((uint)fVar10));
    auVar29 = vshufps_avx(auVar71,auVar71,0xe1);
    auVar72._0_4_ = auVar71._0_4_ * fVar50;
    auVar72._4_4_ = auVar71._4_4_ * fVar67;
    auVar72._8_4_ = auVar71._8_4_ * fVar35;
    auVar72._12_4_ = auVar71._12_4_ * fVar9;
    auVar26 = vmovshdup_avx(auVar72);
    local_118._0_4_ =
         fVar25 * fVar50 + auVar71._0_4_ * auVar27._0_4_ + auVar28._0_4_ * auVar29._0_4_;
    local_118._4_4_ =
         fVar25 * fVar67 + auVar71._4_4_ * auVar27._4_4_ + auVar28._4_4_ * auVar29._4_4_;
    fStack_110 = fVar25 * fVar35 + auVar71._8_4_ * auVar27._8_4_ + auVar28._8_4_ * auVar29._8_4_;
    fStack_10c = fVar25 * fVar9 + auVar71._12_4_ * auVar27._12_4_ + auVar28._12_4_ * auVar29._12_4_;
    fVar35 = fVar25 * auVar58._0_4_ + (auVar71._0_4_ * fVar50 * -fVar61 - auVar26._0_4_);
    fVar67 = this->radius;
    auVar54._0_4_ = fVar66 + fVar67 * (float)local_118._0_4_;
    auVar54._4_4_ = fVar65 + fVar67 * (float)local_118._4_4_;
    auVar54._8_4_ = fVar75 + fVar67 * fStack_110;
    auVar54._12_4_ = fVar74 + fVar67 * fStack_10c;
    local_b8._8_4_ = fVar23 + fVar67 * fVar35;
    uVar2 = vmovlps_avx(auVar54);
    local_b8._0_4_ = (undefined4)uVar2;
    local_b8._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    bVar8 = this->reverseOrientation;
    if (bVar8 != false) {
      local_118._0_4_ = -(float)local_118._0_4_;
      local_118._4_4_ = -(float)local_118._4_4_;
      fStack_110 = -fStack_110;
      fStack_10c = -fStack_10c;
    }
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx(ZEXT416((uint)local_b8._8_4_),auVar43);
    auVar29 = vandps_avx(auVar54,auVar43);
    auVar15._8_4_ = 0x34a00003;
    auVar15._0_8_ = 0x34a0000334a00003;
    auVar15._12_4_ = 0x34a00003;
    auVar29 = vmulps_avx512vl(auVar29,auVar15);
    local_30.z = auVar26._0_4_ * 2.980233e-07;
    local_30._0_8_ = vmovlps_avx(auVar29);
    Point3fi::Point3fi((Point3fi *)__return_storage_ptr__,(Point3f *)&local_b8.__align,
                       (Vector3f *)&local_30);
    FVar1 = ctx->time;
    __return_storage_ptr__->set = true;
    *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = FVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x24) = 0;
    uVar2 = vmovlps_avx(_local_118);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar2;
    *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         (uint)(bVar8 & 1) * (int)-fVar35 + (uint)!(bool)(bVar8 & 1) * (int)fVar35;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = ZEXT816(0) << 0x20
    ;
    *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = ZEXT816(0) << 0x20
    ;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 1.0 / (local_11c * 6.2831855);
  }
  else {
    Sample((optional<pbrt::ShapeSample> *)&local_b8.__align,this,u);
    if (local_60 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
    }
    local_b8._24_4_ = ctx->time;
    auVar22._4_4_ = local_b8._12_4_;
    auVar22._0_4_ = local_b8._8_4_;
    auVar22._8_4_ = local_b8._16_4_;
    auVar22._12_4_ = local_b8._20_4_;
    fVar66 = ((float)local_b8._0_4_ + (float)local_b8._4_4_) * 0.5 -
             ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high) * 0.5;
    auVar4._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar4._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.high;
    auVar4._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .z.low;
    auVar4._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
    auVar26 = vinsertps_avx(auVar22,ZEXT416((uint)local_b8._20_4_),0x10);
    auVar51._0_4_ = ((float)local_b8._12_4_ + auVar26._0_4_) * 0.5;
    auVar51._4_4_ = ((float)local_b8._16_4_ + auVar26._4_4_) * 0.5;
    auVar51._8_4_ = (auVar26._8_4_ + 0.0) * 0.5;
    auVar51._12_4_ = (auVar26._12_4_ + 0.0) * 0.5;
    uVar2 = *(undefined8 *)
             &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              high;
    auVar26 = vinsertps_avx(auVar4,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                            0x10);
    auVar39._0_4_ = ((float)uVar2 + auVar26._0_4_) * 0.5;
    auVar39._4_4_ = ((float)((ulong)uVar2 >> 0x20) + auVar26._4_4_) * 0.5;
    auVar39._8_4_ = (auVar26._8_4_ + 0.0) * 0.5;
    auVar39._12_4_ = (auVar26._12_4_ + 0.0) * 0.5;
    auVar29 = vsubps_avx(auVar51,auVar39);
    auVar52._0_4_ = auVar29._0_4_ * auVar29._0_4_;
    auVar52._4_4_ = auVar29._4_4_ * auVar29._4_4_;
    fVar35 = auVar29._8_4_;
    auVar52._8_4_ = fVar35 * fVar35;
    fVar23 = auVar29._12_4_;
    auVar52._12_4_ = fVar23 * fVar23;
    auVar26 = vmovshdup_avx(auVar52);
    fVar67 = fVar66 * fVar66 + auVar52._0_4_ + auVar26._0_4_;
    if ((fVar67 != 0.0) || (NAN(fVar67))) {
      if (fVar67 < 0.0) {
        fVar67 = sqrtf(fVar67);
      }
      else {
        auVar26 = vsqrtss_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
        fVar67 = auVar26._0_4_;
      }
      if (local_60 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      auVar59._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
      auVar59._8_4_ = -fVar35;
      auVar59._12_4_ = -fVar23;
      auVar63._4_4_ = fVar67;
      auVar63._0_4_ = fVar67;
      auVar63._8_4_ = fVar67;
      auVar63._12_4_ = fVar67;
      auVar26 = vdivps_avx(auVar59,auVar63);
      auVar64._4_4_ = local_b8._48_4_;
      auVar64._0_4_ = local_b8._44_4_;
      auVar64._8_8_ = 0;
      auVar73._0_4_ = auVar26._0_4_ * (float)local_b8._44_4_;
      auVar73._4_4_ = auVar26._4_4_ * (float)local_b8._48_4_;
      auVar73._8_4_ = auVar26._8_4_ * 0.0;
      auVar73._12_4_ = auVar26._12_4_ * 0.0;
      uVar17 = CONCAT44(auVar73._4_4_,auVar73._0_4_);
      auVar55._0_8_ = uVar17 ^ 0x8000000080000000;
      auVar55._8_4_ = -auVar73._8_4_;
      auVar55._12_4_ = -auVar73._12_4_;
      auVar29 = vpermi2ps_avx512vl(_DAT_00457b00,auVar73,auVar55);
      auVar26 = vfmadd231ps_fma(auVar29,auVar64,auVar26);
      auVar26 = vhaddps_avx(auVar26,auVar26);
      auVar26 = vfnmadd231ss_fma(auVar26,ZEXT416((uint)(fVar66 / fVar67)),
                                 ZEXT416((uint)local_b8._40_4_));
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx512vl(auVar26,auVar16);
      auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar6._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar20._4_4_ = local_b8._4_4_;
      auVar20._0_4_ = local_b8._0_4_;
      auVar20._8_4_ = local_b8._8_4_;
      auVar20._12_4_ = local_b8._12_4_;
      auVar21._4_4_ = local_b8._8_4_;
      auVar21._0_4_ = local_b8._4_4_;
      auVar21._8_4_ = local_b8._12_4_;
      auVar21._12_4_ = local_b8._16_4_;
      fVar67 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
               ((float)local_b8._8_4_ + (float)local_b8._12_4_) * 0.5;
      auVar26 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
                              ,0x10);
      auVar29 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar56._0_4_ = (auVar26._0_4_ + auVar29._0_4_) * 0.5;
      auVar56._4_4_ = (auVar26._4_4_ + auVar29._4_4_) * 0.5;
      auVar56._8_4_ = (auVar26._8_4_ + auVar29._8_4_) * 0.5;
      auVar56._12_4_ = (auVar26._12_4_ + auVar29._12_4_) * 0.5;
      auVar26 = vinsertps_avx(auVar20,ZEXT416((uint)local_b8._16_4_),0x10);
      auVar29 = vinsertps_avx(auVar21,ZEXT416((uint)local_b8._20_4_),0x10);
      auVar60._0_4_ = (auVar26._0_4_ + auVar29._0_4_) * 0.5;
      auVar60._4_4_ = (auVar26._4_4_ + auVar29._4_4_) * 0.5;
      auVar60._8_4_ = (auVar26._8_4_ + auVar29._8_4_) * 0.5;
      auVar60._12_4_ = (auVar26._12_4_ + auVar29._12_4_) * 0.5;
      auVar26 = vsubps_avx(auVar56,auVar60);
      auVar57._0_4_ = auVar26._0_4_ * auVar26._0_4_;
      auVar57._4_4_ = auVar26._4_4_ * auVar26._4_4_;
      auVar57._8_4_ = auVar26._8_4_ * auVar26._8_4_;
      auVar57._12_4_ = auVar26._12_4_ * auVar26._12_4_;
      auVar26 = vmovshdup_avx(auVar57);
      fVar67 = (float)local_b8._80_4_ /
               (auVar27._0_4_ / (auVar57._0_4_ + fVar67 * fVar67 + auVar26._0_4_));
      if (ABS(fVar67) != INFINITY) {
        __return_storage_ptr__->set = local_60;
        aVar19._4_4_ = local_b8._4_4_;
        aVar19._0_4_ = local_b8._0_4_;
        (__return_storage_ptr__->optionalValue).__align = aVar19;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
             CONCAT44(local_b8._12_4_,local_b8._8_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
             CONCAT44(local_b8._20_4_,local_b8._16_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
             CONCAT44(local_b8._28_4_,local_b8._24_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_b8._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
             CONCAT44(local_b8._44_4_,local_b8._40_4_);
        *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
             CONCAT44(local_b8._52_4_,local_b8._48_4_);
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_b8._56_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_b8._64_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
        *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_b8._72_8_;
        *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar67;
        return __return_storage_ptr__;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Sample uniformly on sphere if $\pt{}$ is inside it
        Point3f pCenter = (*renderFromObject)(Point3f(0, 0, 0));
        Point3f pOrigin = ctx.OffsetRayOrigin(pCenter);
        if (DistanceSquared(pOrigin, pCenter) <= Sqr(radius)) {
            // Uniformly sample shape and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert uniform area sample PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample sphere uniformly inside subtended cone
        // Compute quantities related the $\theta_\roman{max}$ for cone
        Float sinThetaMax = radius / Distance(ctx.p(), pCenter);
        Float sin2ThetaMax = Sqr(sinThetaMax);
        Float cosThetaMax = SafeSqrt(1 - sin2ThetaMax);
        Float oneMinusCosThetaMax = 1 - cosThetaMax;

        // Compute $\theta$ and $\phi$ values for sample in cone
        Float cosTheta = (cosThetaMax - 1) * u[0] + 1;
        Float sin2Theta = 1 - Sqr(cosTheta);
        if (sin2ThetaMax < 0.00068523f /* sin^2(1.5 deg) */) {
            // Compute cone sample via Taylor series expansion for small angles
            sin2Theta = sin2ThetaMax * u[0];
            cosTheta = std::sqrt(1 - sin2Theta);
            oneMinusCosThetaMax = sin2ThetaMax / 2;
        }

        // Compute angle $\alpha$ from center of sphere to sampled point on surface
        Float cosAlpha = sin2Theta / sinThetaMax +
                         cosTheta * SafeSqrt(1 - sin2Theta / Sqr(sinThetaMax));
        Float sinAlpha = SafeSqrt(1 - Sqr(cosAlpha));

        // Compute surface normal and sampled point on sphere
        Float phi = u[1] * 2 * Pi;
        Vector3f w = SphericalDirection(sinAlpha, cosAlpha, phi);
        Frame samplingFrame = Frame::FromZ(Normalize(pCenter - ctx.p()));
        Normal3f n(samplingFrame.FromLocal(-w));
        Point3f p = pCenter + radius * Point3f(n.x, n.y, n.z);
        if (reverseOrientation)
            n *= -1;

        // Return _ShapeSample_ for sampled point on sphere
        // Compute _pError_ for sampled point on sphere
        Vector3f pError = gamma(5) * Abs((Vector3f)p);

        DCHECK_NE(oneMinusCosThetaMax, 0);  // very small far away sphere
        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time),
                           1 / (2 * Pi * oneMinusCosThetaMax)};
    }